

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

JavascriptFunction *
Js::JavascriptExceptionOperators::WalkStackForExceptionContextInternal
          (ScriptContext *scriptContext,JavascriptExceptionContext *exceptionContext,
          Var thrownObject,uint32 *callerByteCodeOffset,uint64 stackCrawlLimit,PVOID returnAddress,
          bool isThrownException,bool resetStack)

{
  code *pcVar1;
  JavascriptError *pJVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  int iVar6;
  Recycler *pRVar7;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this;
  JavascriptExceptionContext *this_00;
  StackTrace *stackTrace_00;
  undefined4 *puVar8;
  bool local_272;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject_1;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  StackFrame stackFrame;
  JavascriptExceptionObject *originalExceptionObject;
  StackTrace *originalStackTrace;
  JavascriptError *errorObject;
  uint64 i;
  code *pcStack_158;
  bool crawlStackForWER;
  undefined8 local_150;
  TrackAllocData local_148;
  AutoNestedHandledExceptionType local_120 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  StackTrace *stackTrace;
  JavascriptFunction *caller;
  ScriptContext *local_f8;
  JavascriptFunction *jsFunc;
  JavascriptStackWalker walker;
  bool resetStack_local;
  bool isThrownException_local;
  PVOID returnAddress_local;
  uint64 stackCrawlLimit_local;
  uint32 *callerByteCodeOffset_local;
  Var thrownObject_local;
  JavascriptExceptionContext *exceptionContext_local;
  ScriptContext *scriptContext_local;
  
  walker.currentFrame.stackCheckCodeHeight._7_1_ = isThrownException;
  walker.currentFrame.stackCheckCodeHeight._6_1_ = resetStack;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)&jsFunc,scriptContext,true,returnAddress,false);
  local_f8 = (ScriptContext *)0x0;
  BVar4 = GetCaller((JavascriptStackWalker *)&jsFunc,(JavascriptFunction **)&local_f8);
  if (BVar4 == 0) {
    scriptContext_local = (ScriptContext *)0x0;
  }
  else {
    bVar3 = JavascriptFunction::IsLibraryCode((JavascriptFunction *)local_f8);
    if ((bVar3) &&
       (BVar4 = JavascriptStackWalker::GetNonLibraryCodeCaller
                          ((JavascriptStackWalker *)&jsFunc,(JavascriptFunction **)&local_f8),
       BVar4 == 0)) {
      scriptContext_local = (ScriptContext *)0x0;
    }
    else {
      scriptContext_local = local_f8;
      uVar5 = JavascriptStackWalker::GetByteCodeOffset((JavascriptStackWalker *)&jsFunc);
      *callerByteCodeOffset = uVar5;
      bVar3 = JavascriptFunction::IsLibraryCode((JavascriptFunction *)scriptContext_local);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x472,"(!caller->IsLibraryCode())","!caller->IsLibraryCode()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ___autoNestedHandledExceptionType =
           (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_120,
                 ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                 ExceptionType_OutOfMemory);
      pRVar7 = ScriptContext::GetRecycler(scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_148,
                 (type_info *)
                 &JsUtil::
                  List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                 ,0x47b);
      pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_148);
      pcStack_158 = Memory::Recycler::AllocInlined;
      local_150 = 0;
      this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,pRVar7,0x43c4b0);
      pRVar7 = ScriptContext::GetRecycler(scriptContext);
      JsUtil::
      List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::List(this,pRVar7,4);
      ___autoNestedHandledExceptionType = this;
      if (stackCrawlLimit != 0) {
        i._7_1_ = CrawlStackForWER(scriptContext);
        errorObject = (JavascriptError *)&DAT_00000001;
        if ((((bool)i._7_1_) && (thrownObject != (Var)0x0)) &&
           (bVar3 = VarIs<Js::JavascriptError>(thrownObject), bVar3)) {
          originalStackTrace = (StackTrace *)VarTo<Js::JavascriptError>(thrownObject);
          originalExceptionObject = (JavascriptExceptionObject *)0x0;
          stackFrame.argumentTypes.types =
               (uint64)JavascriptError::GetJavascriptExceptionObject
                                 ((JavascriptError *)originalStackTrace);
          if ((((walker.currentFrame.stackCheckCodeHeight._6_1_ & 1) == 0) &&
              (iVar6 = (*(originalStackTrace->
                         super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                         )._vptr_ReadOnlyList[0x14])
                                 (originalStackTrace,originalStackTrace,5,&originalExceptionObject,0
                                  ,scriptContext), iVar6 != 0)) &&
             (originalExceptionObject != (JavascriptExceptionObject *)0x0)) {
            JavascriptExceptionContext::SetOriginalStackTrace
                      (exceptionContext,(StackTrace *)originalExceptionObject);
          }
          else if (stackFrame.argumentTypes.types != 0) {
            this_00 = JavascriptExceptionObject::GetExceptionContext
                                ((JavascriptExceptionObject *)stackFrame.argumentTypes.types);
            stackTrace_00 = JavascriptExceptionContext::GetStackTrace(this_00);
            JavascriptExceptionContext::SetOriginalStackTrace(exceptionContext,stackTrace_00);
          }
        }
        do {
          JavascriptExceptionContext::StackFrame::StackFrame
                    ((StackFrame *)&err,(JavascriptFunction *)local_f8,
                     (JavascriptStackWalker *)&jsFunc,(bool)(i._7_1_ & 1));
          JsUtil::
          List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(___autoNestedHandledExceptionType,(StackFrame *)&err);
          local_272 = JavascriptStackWalker::GetDisplayCaller
                                ((JavascriptStackWalker *)&jsFunc,(JavascriptFunction **)&local_f8);
          pJVar2 = errorObject;
          if (local_272) {
            errorObject = (JavascriptError *)
                          ((long)&(errorObject->super_DynamicObject).super_RecyclableObject.
                                  super_FinalizableObject.super_IRecyclerVisitedObject.
                                  _vptr_IRecyclerVisitedObject + 1);
          }
          local_272 = local_272 && pJVar2 < stackCrawlLimit;
        } while (local_272);
      }
      BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x49d,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                           "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_120);
      if (___autoNestedHandledExceptionType != (StackTrace *)0x0) {
        JavascriptExceptionContext::SetStackTrace
                  (exceptionContext,___autoNestedHandledExceptionType);
        DumpStackTrace(exceptionContext,(bool)(walker.currentFrame.stackCheckCodeHeight._7_1_ & 1));
      }
    }
  }
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&jsFunc);
  return (JavascriptFunction *)scriptContext_local;
}

Assistant:

JavascriptFunction *
    JavascriptExceptionOperators::WalkStackForExceptionContextInternal(ScriptContext& scriptContext, JavascriptExceptionContext& exceptionContext, Var thrownObject,
        uint32& callerByteCodeOffset, uint64 stackCrawlLimit, PVOID returnAddress, bool isThrownException, bool resetStack)
    {
        JavascriptStackWalker walker(&scriptContext, true, returnAddress);
        JavascriptFunction* jsFunc = nullptr;

        if (!GetCaller(walker, jsFunc))
        {
            return nullptr;
        }

        // Skip to first non-Library code
        // Similar behavior to GetCaller returning false
        if(jsFunc->IsLibraryCode() && !walker.GetNonLibraryCodeCaller(&jsFunc))
        {
            return nullptr;
        }

        JavascriptFunction * caller = jsFunc;
        callerByteCodeOffset = walker.GetByteCodeOffset();

        Assert(!caller->IsLibraryCode());
        // NOTE Don't set the throwing exception here, because we might need to box it and will cause a nested stack walker
        // instead, return it to be set in WalkStackForExceptionContext

        JavascriptExceptionContext::StackTrace *stackTrace = nullptr;
        // If we take an OOM (JavascriptException for OOM if script is active), just bail early and return what we've got
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            stackTrace = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
            if (stackCrawlLimit > 0)
            {
                const bool crawlStackForWER = CrawlStackForWER(scriptContext);

                // In WER scenario, we should combine the original stack with latest throw stack as the final throw might be coming form
                // a different stack.
                uint64 i = 1;
                if (crawlStackForWER && thrownObject && Js::VarIs<Js::JavascriptError>(thrownObject))
                {
                    Js::JavascriptError* errorObject = Js::VarTo<Js::JavascriptError>(thrownObject);
                    Js::JavascriptExceptionContext::StackTrace *originalStackTrace = NULL;
                    const Js::JavascriptExceptionObject* originalExceptionObject = errorObject->GetJavascriptExceptionObject();
                    if (!resetStack && errorObject->GetInternalProperty(errorObject, InternalPropertyIds::StackTrace, (Js::Var*) &originalStackTrace, NULL, &scriptContext) &&
                        (originalStackTrace != nullptr))
                    {
                        exceptionContext.SetOriginalStackTrace(originalStackTrace);
                    }
                    else
                    {
                        if (originalExceptionObject != nullptr)
                        {
                            exceptionContext.SetOriginalStackTrace(originalExceptionObject->GetExceptionContext()->GetStackTrace());
                        }
                    }
                }

                do
                {
                    JavascriptExceptionContext::StackFrame stackFrame(jsFunc, walker, crawlStackForWER);
                    stackTrace->Add(stackFrame);
                } while (walker.GetDisplayCaller(&jsFunc) && i++ < stackCrawlLimit);
            }
        }